

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphStatistics.cpp
# Opt level: O2

void __thiscall
floorplan::GraphStatistics::saveDistToFile
          (GraphStatistics *this,string *filename,DistVectorByLabel *dist)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  uint uVar3;
  ofstream out;
  
  std::ofstream::ofstream((ostream *)&out,(filename->_M_dataplus)._M_p,_S_out);
  for (p_Var2 = (dist->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(dist->_M_t)._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<((ostream *)&out,(string *)(p_Var2 + 1));
    std::operator<<(poVar1,", ");
    uVar3 = 0;
    while( true ) {
      if ((ulong)((long)p_Var2[2]._M_parent - *(long *)(p_Var2 + 2) >> 3) <= (ulong)uVar3) break;
      poVar1 = std::ostream::_M_insert<double>
                         (*(double *)(*(long *)(p_Var2 + 2) + (ulong)uVar3 * 8));
      std::operator<<(poVar1," ");
      uVar3 = uVar3 + 1;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&out);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&out);
  return;
}

Assistant:

void GraphStatistics::saveDistToFile(string filename, DistVectorByLabel dist){
    std::ofstream out(filename.c_str() );
    DistVectorByLabel::iterator it = dist.begin();

    for (; it != dist.end(); ++it){
        out << it->first << ", ";
        for (unsigned int i = 0; i < it->second.size(); i++){
            out << it->second[i] << " ";
        }
        out << endl;
    }
    out.close();
}